

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void integer_suite::test_uint16_4(void)

{
  unsigned_short uVar1;
  char input [5];
  decoder_type decoder;
  undefined4 local_170;
  value local_16c;
  value_type local_168 [8];
  basic_decoder<char> local_160;
  
  builtin_memcpy(local_168,"1234",5);
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<5ul>
            (&local_160,(value_type (*) [5])local_168);
  local_16c = local_160.current.code;
  local_170 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x304,"void integer_suite::test_uint16_4()",&local_16c,&local_170);
  uVar1 = trial::protocol::json::detail::basic_decoder<char>::unsigned_value<unsigned_short>
                    (&local_160);
  local_170 = CONCAT22(local_170._2_2_,uVar1);
  local_16c = 0x4d2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_short,unsigned_int>
            ("decoder.unsigned_value<std::uint16_t>()","1234U",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x305,"void integer_suite::test_uint16_4()",&local_170,&local_16c);
  trial::protocol::json::detail::basic_decoder<char>::next(&local_160);
  local_16c = local_160.current.code;
  local_170 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x307,"void integer_suite::test_uint16_4()",&local_16c,&local_170);
  return;
}

Assistant:

void test_uint16_4()
{
    const char input[] = "1234";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.unsigned_value<std::uint16_t>(), 1234U);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}